

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

vector<Range,_std::allocator<Range>_> *
subtractRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,
              vector<Range,_std::allocator<Range>_> *ranges,
              vector<Range,_std::allocator<Range>_> *subtractions)

{
  bool bVar1;
  reference __x;
  Range *split_range;
  iterator __end3;
  iterator __begin3;
  vector<Range,_std::allocator<Range>_> local_a0;
  vector<Range,_std::allocator<Range>_> *local_88;
  vector<Range,_std::allocator<Range>_> *__range3;
  Range *range;
  iterator __end2;
  iterator __begin2;
  vector<Range,_std::allocator<Range>_> *__range2;
  vector<Range,_std::allocator<Range>_> split_results;
  Range *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Range,_std::allocator<Range>_> *__range1;
  vector<Range,_std::allocator<Range>_> *subtractions_local;
  vector<Range,_std::allocator<Range>_> *ranges_local;
  vector<Range,_std::allocator<Range>_> *results;
  
  std::vector<Range,_std::allocator<Range>_>::vector(__return_storage_ptr__,ranges);
  __end1 = std::vector<Range,_std::allocator<Range>_>::begin(subtractions);
  s = (Range *)std::vector<Range,_std::allocator<Range>_>::end(subtractions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                     *)&s), bVar1) {
    split_results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         __gnu_cxx::__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
         operator*(&__end1);
    std::vector<Range,_std::allocator<Range>_>::vector
              ((vector<Range,_std::allocator<Range>_> *)&__range2);
    __end2 = std::vector<Range,_std::allocator<Range>_>::begin(__return_storage_ptr__);
    range = (Range *)std::vector<Range,_std::allocator<Range>_>::end(__return_storage_ptr__);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                       *)&range), bVar1) {
      __range3 = (vector<Range,_std::allocator<Range>_> *)
                 __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                 ::operator*(&__end2);
      Range::subtract(&local_a0,(Range *)__range3,
                      split_results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      local_88 = &local_a0;
      __end3 = std::vector<Range,_std::allocator<Range>_>::begin(local_88);
      split_range = (Range *)std::vector<Range,_std::allocator<Range>_>::end(local_88);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                         *)&split_range), bVar1) {
        __x = __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
              operator*(&__end3);
        std::vector<Range,_std::allocator<Range>_>::push_back
                  ((vector<Range,_std::allocator<Range>_> *)&__range2,__x);
        __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
        operator++(&__end3);
      }
      std::vector<Range,_std::allocator<Range>_>::~vector(&local_a0);
      __gnu_cxx::__normal_iterator<Range_*,_std::vector<Range,_std::allocator<Range>_>_>::operator++
                (&__end2);
    }
    std::vector<Range,_std::allocator<Range>_>::operator=
              (__return_storage_ptr__,(vector<Range,_std::allocator<Range>_> *)&__range2);
    std::vector<Range,_std::allocator<Range>_>::~vector
              ((vector<Range,_std::allocator<Range>_> *)&__range2);
    __gnu_cxx::__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> subtractRanges (
  const std::vector <Range>& ranges,
  const std::vector <Range>& subtractions)
{
  std::vector <Range> results = ranges;
  for (auto& s : subtractions)
  {
    std::vector <Range> split_results;
    for (auto& range : results)
      for (auto& split_range : range.subtract (s))
        split_results.push_back (split_range);

    results = split_results;
  }

  return results;
}